

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O2

String * __thiscall
Diligent::BasicPlatformDebug::FormatDebugMessage_abi_cxx11_
          (String *__return_storage_ptr__,BasicPlatformDebug *this,DEBUG_MESSAGE_SEVERITY Severity,
          Char *Message,char *Function,char *File,int Line)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  stringstream msg_ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg_ss);
  iVar1 = *(int *)(
                  _ZZN8Diligent18BasicPlatformDebug18FormatDebugMessageB5cxx11ENS_22DEBUG_MESSAGE_SEVERITYEPKcS3_S3_iE13strSeverities_rel
                  + (long)(int)this * 4);
  poVar2 = std::operator<<(local_1a8,"Diligent Engine: ");
  std::operator<<(poVar2,_ZZN8Diligent18BasicPlatformDebug18FormatDebugMessageB5cxx11ENS_22DEBUG_MESSAGE_SEVERITYEPKcS3_S3_iE13strSeverities_rel
                         + iVar1);
  if (Message != (Char *)0x0 || Function != (char *)0x0) {
    std::operator<<(local_1a8," in ");
    if (Message == (Char *)0x0) {
      if (Function == (char *)0x0) goto LAB_0028b437;
    }
    else {
      poVar2 = std::operator<<(local_1a8,Message);
      std::operator<<(poVar2,"()");
      if (Function == (char *)0x0) goto LAB_0028b437;
      std::operator<<(local_1a8," (");
    }
    poVar2 = std::operator<<(local_1a8,Function);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)File);
    std::operator<<(poVar2,')');
  }
LAB_0028b437:
  poVar2 = std::operator<<(local_1a8,": ");
  poVar2 = std::operator<<(poVar2,(char *)CONCAT44(in_register_00000014,Severity));
  std::operator<<(poVar2,'\n');
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg_ss);
  return __return_storage_ptr__;
}

Assistant:

String BasicPlatformDebug::FormatDebugMessage(DEBUG_MESSAGE_SEVERITY Severity,
                                              const Char*            Message,
                                              const char*            Function, // type of __FUNCTION__
                                              const char*            File,     // type of __FILE__
                                              int                    Line)
{
    std::stringstream msg_ss;

    static const Char* const strSeverities[] = {"Info", "Warning", "ERROR", "CRITICAL ERROR"};
    const auto*              MessageSevery   = strSeverities[static_cast<int>(Severity)];

    msg_ss << "Diligent Engine: " << MessageSevery;
    if (Function != nullptr || File != nullptr)
    {
        msg_ss << " in ";
        if (Function != nullptr)
        {
            msg_ss << Function << "()";
            if (File != nullptr)
                msg_ss << " (";
        }

        if (File != nullptr)
        {
            msg_ss << File << ", " << Line << ')';
        }
    }
    msg_ss << ": " << Message << '\n';

    return msg_ss.str();
}